

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowControl.hpp
# Opt level: O0

void InstructionSet::x86::Primitive::
     ret_far<InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
               (Instruction<false> instruction,Context *context)

{
  unsigned_short address;
  unsigned_short segment;
  ImmediateT IVar1;
  uint16_t *puVar2;
  unsigned_short cs;
  unsigned_short ip;
  Context *context_local;
  Instruction<false> instruction_local;
  
  context_local = (Context *)instruction;
  PCCompatible::Memory::preauthorise_stack_read(&context->memory,4);
  address = pop<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                      (context);
  segment = pop<unsigned_short,true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>::Context>
                      (context);
  IVar1 = Instruction<false>::operand((Instruction<false> *)&context_local);
  puVar2 = PCCompatible::Registers::sp(&context->registers);
  *puVar2 = *puVar2 + IVar1;
  PCCompatible::FlowController::jump<unsigned_short>(&context->flow_controller,segment,address);
  return;
}

Assistant:

void ret_far(
	InstructionT instruction,
	ContextT &context
) {
	context.memory.preauthorise_stack_read(sizeof(uint16_t) * 2);
	const auto ip = pop<uint16_t, true>(context);
	const auto cs = pop<uint16_t, true>(context);
	context.registers.sp() += instruction.operand();
	context.flow_controller.template jump<uint16_t>(cs, ip);
}